

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_25095d::Db::parseQualifiedType(Db *this)

{
  Cache CVar1;
  char *pcVar2;
  char *pcVar3;
  Cache CVar4;
  Cache CVar5;
  bool bVar6;
  Qualifiers QVar7;
  Node *pNVar8;
  Node *pNVar9;
  ulong uVar10;
  StringView SVar11;
  StringView Qual;
  
  pcVar2 = this->First;
  if ((pcVar2 == this->Last) || (*pcVar2 != 'U')) {
    QVar7 = parseCVQualifiers(this);
    pNVar8 = parseType(this);
    if (pNVar8 != (Node *)0x0) {
      if (QVar7 == QualNone) {
        return pNVar8;
      }
      pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      CVar4 = pNVar8->RHSComponentCache;
      CVar5 = pNVar8->ArrayCache;
      CVar1 = pNVar8->FunctionCache;
      pNVar9->K = KQualType;
      pNVar9->RHSComponentCache = CVar4;
      pNVar9->ArrayCache = CVar5;
      pNVar9->FunctionCache = CVar1;
      pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c6a30;
      *(Qualifiers *)&pNVar9->field_0xc = QVar7;
      pNVar9[1]._vptr_Node = (_func_int **)pNVar8;
      return pNVar9;
    }
  }
  else {
    this->First = pcVar2 + 1;
    Qual = parseBareSourceName(this);
    if (Qual.First != Qual.Last) {
      SVar11.Last = "";
      SVar11.First = "objcproto";
      bVar6 = StringView::startsWith(&Qual,SVar11);
      if (bVar6) {
        uVar10 = 9;
        if ((ulong)((long)Qual.Last - (long)Qual.First) < 9) {
          uVar10 = (long)Qual.Last - (long)Qual.First;
        }
        pcVar2 = this->First;
        pcVar3 = this->Last;
        this->First = Qual.First + uVar10;
        this->Last = Qual.Last;
        SVar11 = parseBareSourceName(this);
        this->First = pcVar2;
        this->Last = pcVar3;
        if ((SVar11.First != SVar11.Last) &&
           (pNVar8 = parseQualifiedType(this), pNVar8 != (Node *)0x0)) {
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KObjCProtoName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c6980;
          Qual = SVar11;
LAB_0017c612:
          pNVar9[1]._vptr_Node = (_func_int **)pNVar8;
          *(StringView *)&pNVar9[1].K = Qual;
          return pNVar9;
        }
      }
      else {
        pNVar8 = parseQualifiedType(this);
        if (pNVar8 != (Node *)0x0) {
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KVendorExtQualType;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c69d8;
          goto LAB_0017c612;
        }
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseQualifiedType() {
  if (consumeIf('U')) {
    StringView Qual = parseBareSourceName();
    if (Qual.empty())
      return nullptr;

    // FIXME parse the optional <template-args> here!

    // extension            ::= U <objc-name> <objc-type>  # objc-type<identifier>
    if (Qual.startsWith("objcproto")) {
      StringView ProtoSourceName = Qual.dropFront(std::strlen("objcproto"));
      StringView Proto;
      {
        SwapAndRestore<const char *> SaveFirst(First, ProtoSourceName.begin()),
                                     SaveLast(Last, ProtoSourceName.end());
        Proto = parseBareSourceName();
      }
      if (Proto.empty())
        return nullptr;
      Node *Child = parseQualifiedType();
      if (Child == nullptr)
        return nullptr;
      return make<ObjCProtoName>(Child, Proto);
    }

    Node *Child = parseQualifiedType();
    if (Child == nullptr)
      return nullptr;
    return make<VendorExtQualType>(Child, Qual);
  }

  Qualifiers Quals = parseCVQualifiers();
  Node *Ty = parseType();
  if (Ty == nullptr)
    return nullptr;
  if (Quals != QualNone)
    Ty = make<QualType>(Ty, Quals);
  return Ty;
}